

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionCompiler.cpp
# Opt level: O2

CHole * __thiscall Refal2::CHole::operator=(CHole *this,CHole *hole)

{
  TTableIndex TVar1;
  
  TVar1 = hole->right;
  this->left = hole->left;
  this->right = TVar1;
  CNodeList<Refal2::CUnit>::Move((CNodeList<Refal2::CUnit> *)hole,(CNodeList<Refal2::CUnit> *)this);
  return this;
}

Assistant:

CHole& CHole::operator=( const CHole& hole )
{
	left = hole.left;
	right = hole.right;
	const_cast<CHole&>( hole ).Move( *this );
	return *this;
}